

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_mark_verify(REF_SUBDIV ref_subdiv)

{
  REF_GRID pRVar1;
  REF_CELL pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  FILE *__s;
  uint uVar5;
  
  pRVar1 = ref_subdiv->grid;
  __s = fopen("ref_subdiv_verify.tec","w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n","ref_subdiv_verify.tec");
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x8c8,
           "ref_subdiv_mark_verify","unable to open file");
    RVar4 = 2;
  }
  else {
    fwrite("title=\"tecplot refine scalar file\"\n",0x23,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"s\"\n",0x1c,1,__s);
    pRVar2 = pRVar1->cell[8];
    for (uVar5 = 0; (int)uVar5 < pRVar2->max; uVar5 = uVar5 + 1) {
      if (pRVar2->c2n[(long)(int)uVar5 * (long)pRVar2->size_per] != -1) {
        uVar3 = ref_subdiv_map(ref_subdiv,pRVar2,uVar5);
        if ((0x3f < uVar3) || ((0x8100004100210917U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
          ref_subdiv_map_to_edge(uVar3);
          printf("tet %d, map %d\n",(ulong)uVar5,(ulong)uVar3);
          ref_subdiv_tec_zone(ref_subdiv,pRVar2,uVar5,(FILE *)__s);
        }
      }
    }
    pRVar2 = pRVar1->cell[9];
    for (uVar5 = 0; (int)uVar5 < pRVar2->max; uVar5 = uVar5 + 1) {
      if (pRVar2->c2n[(long)(int)uVar5 * (long)pRVar2->size_per] != -1) {
        uVar3 = ref_subdiv_map(ref_subdiv,pRVar2,uVar5);
        if ((((0x34 < uVar3 - 0x14) ||
             ((0x10000000004001U >> ((ulong)(uVar3 - 0x14) & 0x3f) & 1) == 0)) &&
            ((0x2f < uVar3 - 0x5c || ((0x802000000001U >> ((ulong)(uVar3 - 0x5c) & 0x3f) & 1) == 0))
            )) && (((uVar3 != 0 && (uVar3 != 0xe1)) && (uVar3 != 0xeb)))) {
          ref_subdiv_map_to_edge(uVar3);
          printf("pyr %d, map %d\n",(ulong)uVar5,(ulong)uVar3);
          ref_subdiv_tec_zone(ref_subdiv,pRVar2,uVar5,(FILE *)__s);
        }
      }
    }
    pRVar2 = pRVar1->cell[10];
    for (uVar5 = 0; (int)uVar5 < pRVar2->max; uVar5 = uVar5 + 1) {
      if (pRVar2->c2n[(long)(int)uVar5 * (long)pRVar2->size_per] != -1) {
        uVar3 = ref_subdiv_map(ref_subdiv,pRVar2,uVar5);
        if ((((uVar3 != 0) && (uVar3 != 0x41)) && (uVar3 != 0x82)) &&
           ((uVar3 != 0x108 && (uVar3 != 0x1cb)))) {
          ref_subdiv_map_to_edge(uVar3);
          printf("pri %d, map %d\n",(ulong)uVar5,(ulong)uVar3);
          ref_subdiv_tec_zone(ref_subdiv,pRVar2,uVar5,(FILE *)__s);
        }
      }
    }
    fclose(__s);
    RVar4 = 0;
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_mark_verify(REF_SUBDIV ref_subdiv) {
  REF_GRID ref_grid = ref_subdiv_grid(ref_subdiv);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT map;

  FILE *file;

  file = fopen("ref_subdiv_verify.tec", "w");
  if (NULL == (void *)file)
    printf("unable to open %s\n", "ref_subdiv_verify.tec");
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine scalar file\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\" \"s\"\n");

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    switch (map) {
      case 0:
      case 1:
      case 2:
      case 4:
      case 8:
      case 16:
      case 32:
      case 11:
      case 56:
      case 38:
      case 21:
      case 63:
        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("tet %d, map %d\n", cell, map);
        RSS(ref_subdiv_tec_zone(ref_subdiv, ref_cell, cell, file), "zone");
    }
  }

  ref_cell = ref_grid_pyr(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    switch (map) {
      case 0:
      case 129:
      case 20:
      case 72:
      case 34:
      case 235:
      case 139:
      case 225:
      case 92:
        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("pyr %d, map %d\n", cell, map);
        RSS(ref_subdiv_tec_zone(ref_subdiv, ref_cell, cell, file), "zone");
    }
  }

  ref_cell = ref_grid_pri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    switch (map) {
      case 0:
      case 65:
      case 130:
      case 264:
      case 459:
        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("pri %d, map %d\n", cell, map);
        RSS(ref_subdiv_tec_zone(ref_subdiv, ref_cell, cell, file), "zone");
    }
  }

  fclose(file);

  return REF_SUCCESS;
}